

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbwrapper.cpp
# Opt level: O2

bool __thiscall CDBWrapper::IsEmpty(CDBWrapper *this)

{
  byte bVar1;
  tuple<CDBIterator_*,_std::default_delete<CDBIterator>_> tVar2;
  long in_FS_OFFSET;
  unique_ptr<CDBIterator,_std::default_delete<CDBIterator>_> it;
  __uniq_ptr_impl<CDBIterator,_std::default_delete<CDBIterator>_> local_18;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  tVar2.super__Tuple_impl<0UL,_CDBIterator_*,_std::default_delete<CDBIterator>_>.
  super__Head_base<0UL,_CDBIterator_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_CDBIterator_*,_std::default_delete<CDBIterator>_>)NewIterator(this);
  local_18._M_t.super__Tuple_impl<0UL,_CDBIterator_*,_std::default_delete<CDBIterator>_>.
  super__Head_base<0UL,_CDBIterator_*,_false>._M_head_impl =
       (tuple<CDBIterator_*,_std::default_delete<CDBIterator>_>)
       (tuple<CDBIterator_*,_std::default_delete<CDBIterator>_>)
       tVar2.super__Tuple_impl<0UL,_CDBIterator_*,_std::default_delete<CDBIterator>_>.
       super__Head_base<0UL,_CDBIterator_*,_false>._M_head_impl;
  (**(code **)(*(long *)(((((unique_ptr<CDBIterator::IteratorImpl,_std::default_delete<CDBIterator::IteratorImpl>_>
                             *)((long)tVar2.
                                      super__Tuple_impl<0UL,_CDBIterator_*,_std::default_delete<CDBIterator>_>
                                      .super__Head_base<0UL,_CDBIterator_*,_false>._M_head_impl + 8)
                           )->_M_t).
                          super___uniq_ptr_impl<CDBIterator::IteratorImpl,_std::default_delete<CDBIterator::IteratorImpl>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_CDBIterator::IteratorImpl_*,_std::default_delete<CDBIterator::IteratorImpl>_>
                          .super__Head_base<0UL,_CDBIterator::IteratorImpl_*,_false>._M_head_impl)->
                        iter)._M_t + 0x18))();
  bVar1 = (**(code **)(*(long *)(((((unique_ptr<CDBIterator::IteratorImpl,_std::default_delete<CDBIterator::IteratorImpl>_>
                                     *)((long)tVar2.
                                              super__Tuple_impl<0UL,_CDBIterator_*,_std::default_delete<CDBIterator>_>
                                              .super__Head_base<0UL,_CDBIterator_*,_false>.
                                              _M_head_impl + 8))->_M_t).
                                  super___uniq_ptr_impl<CDBIterator::IteratorImpl,_std::default_delete<CDBIterator::IteratorImpl>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_CDBIterator::IteratorImpl_*,_std::default_delete<CDBIterator::IteratorImpl>_>
                                  .super__Head_base<0UL,_CDBIterator::IteratorImpl_*,_false>.
                                 _M_head_impl)->iter)._M_t + 0x10))();
  std::unique_ptr<CDBIterator,_std::default_delete<CDBIterator>_>::~unique_ptr
            ((unique_ptr<CDBIterator,_std::default_delete<CDBIterator>_> *)&local_18);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return (bool)(bVar1 ^ 1);
  }
  __stack_chk_fail();
}

Assistant:

bool CDBWrapper::IsEmpty()
{
    std::unique_ptr<CDBIterator> it(NewIterator());
    it->SeekToFirst();
    return !(it->Valid());
}